

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

shared_ptr<kratos::AssignStmt> __thiscall
kratos::Var::assign(Var *this,Var *var,AssignmentType type)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::AssignStmt> sVar1;
  undefined1 local_38 [8];
  shared_ptr<kratos::Var> var_ptr;
  AssignmentType type_local;
  Var *var_local;
  Var *this_local;
  
  std::enable_shared_from_this<kratos::Var>::shared_from_this
            ((enable_shared_from_this<kratos::Var> *)local_38);
  assign(this,(shared_ptr<kratos::Var> *)var,
         (AssignmentType)(enable_shared_from_this<kratos::Var> *)local_38);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_38);
  sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> Var::assign(Var &var, AssignmentType type) {
    // need to find the pointer
    auto var_ptr = var.shared_from_this();
    return assign(var_ptr, type);
}